

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int FindMTMessage(uchar *buf,int buflen,int addr,int mid,uchar **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  
  *pFoundMsg = buf;
  *pFoundMsgTmpLen = buflen;
  do {
    iVar1 = AnalyzeMTMessage(buf,buflen,addr,mid);
    if (iVar1 == 0) {
      return 0;
    }
    buf = *pFoundMsg + 1;
    *pFoundMsg = buf;
    iVar1 = *pFoundMsgTmpLen;
    buflen = iVar1 + -1;
    *pFoundMsgTmpLen = buflen;
  } while (5 < iVar1);
  *pFoundMsg = (uchar *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindMTMessage(unsigned char* buf, int buflen, int addr, int mid, unsigned char** pFoundMsg, int* pFoundMsgTmpLen)
{
	*pFoundMsg = buf;
	*pFoundMsgTmpLen = buflen;

	while (AnalyzeMTMessage(*pFoundMsg, *pFoundMsgTmpLen, addr, mid) != EXIT_SUCCESS)
	{
		(*pFoundMsg)++;
		(*pFoundMsgTmpLen)--;
		if (*pFoundMsgTmpLen < MIN_STANDARD_BUF_LEN_MT)
		{
			*pFoundMsg = NULL;
			*pFoundMsgTmpLen = 0;
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}